

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O0

void * Thread::threadFun(void *arg)

{
  Thread *thread;
  void *arg_local;
  
  std::function<void_()>::operator()((function<void_()> *)((long)arg + 8));
  return (void *)0x0;
}

Assistant:

void* Thread::threadFun(void* arg)
{
    Thread* thread= static_cast<Thread*>(arg);
    thread->threadFun_();
    return NULL;
}